

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

void __thiscall
icu_63::Calendar::prepareGetActual
          (Calendar *this,UCalendarDateFields field,UBool isMinimum,UErrorCode *status)

{
  UCalendarDaysOfWeek value;
  int iVar1;
  UCalendarDaysOfWeek UVar2;
  UCalendarDateFields field_00;
  
  set(this,UCAL_MILLISECONDS_IN_DAY,0);
  switch(field) {
  case UCAL_MONTH:
switchD_001f4283_caseD_2:
    value = (*(this->super_UObject)._vptr_UObject[0x12])(this,5);
    field_00 = UCAL_DATE;
    break;
  case UCAL_WEEK_OF_YEAR:
  case UCAL_WEEK_OF_MONTH:
    value = this->fFirstDayOfWeek;
    if (isMinimum != '\0') {
      iVar1 = (int)((ulong)((long)(int)(value + UCAL_FRIDAY) * -0x6db6db6d) >> 0x20) + value + 6;
      iVar1 = ((iVar1 >> 2) - (iVar1 >> 0x1f)) * -7;
      UVar2 = value + iVar1 + UCAL_FRIDAY;
      value = value + 0xd + iVar1;
      if (0 < (int)UVar2) {
        value = UVar2;
      }
    }
    field_00 = UCAL_DAY_OF_WEEK;
    break;
  case UCAL_DATE:
  case UCAL_DAY_OF_YEAR:
  case UCAL_DAY_OF_WEEK:
    goto switchD_001f4283_caseD_5;
  case UCAL_DAY_OF_WEEK_IN_MONTH:
    set(this,UCAL_DATE,1);
    value = 0;
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
       (complete(this,status), value = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
      value = this->fFields[7];
    }
    field_00 = UCAL_DAY_OF_WEEK;
    break;
  default:
    if (field == UCAL_YEAR_WOY) {
      iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,3);
      set(this,UCAL_WEEK_OF_YEAR,iVar1);
      goto switchD_001f4283_caseD_2;
    }
    if (field != UCAL_EXTENDED_YEAR) goto switchD_001f4283_caseD_5;
  case UCAL_YEAR:
    value = (*(this->super_UObject)._vptr_UObject[0x12])(this,6);
    field_00 = UCAL_DAY_OF_YEAR;
  }
  set(this,field_00,value);
switchD_001f4283_caseD_5:
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,field);
  set(this,field,iVar1);
  return;
}

Assistant:

void Calendar::prepareGetActual(UCalendarDateFields field, UBool isMinimum, UErrorCode &status)
{
    set(UCAL_MILLISECONDS_IN_DAY, 0);

    switch (field) {
    case UCAL_YEAR:
    case UCAL_EXTENDED_YEAR:
        set(UCAL_DAY_OF_YEAR, getGreatestMinimum(UCAL_DAY_OF_YEAR));
        break;

    case UCAL_YEAR_WOY:
        set(UCAL_WEEK_OF_YEAR, getGreatestMinimum(UCAL_WEEK_OF_YEAR));
        U_FALLTHROUGH;
    case UCAL_MONTH:
        set(UCAL_DATE, getGreatestMinimum(UCAL_DATE));
        break;

    case UCAL_DAY_OF_WEEK_IN_MONTH:
        // For dowim, the maximum occurs for the DOW of the first of the
        // month.
        set(UCAL_DATE, 1);
        set(UCAL_DAY_OF_WEEK, get(UCAL_DAY_OF_WEEK, status)); // Make this user set
        break;

    case UCAL_WEEK_OF_MONTH:
    case UCAL_WEEK_OF_YEAR:
        // If we're counting weeks, set the day of the week to either the
        // first or last localized DOW.  We know the last week of a month
        // or year will contain the first day of the week, and that the
        // first week will contain the last DOW.
        {
            int32_t dow = fFirstDayOfWeek;
            if (isMinimum) {
                dow = (dow + 6) % 7; // set to last DOW
                if (dow < UCAL_SUNDAY) {
                    dow += 7;
                }
            }
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "prepareGetActualHelper(WOM/WOY) - dow=%d\n", dow);
#endif
            set(UCAL_DAY_OF_WEEK, dow);
        }
        break;
    default:
        break;
    }

    // Do this last to give it the newest time stamp
    set(field, getGreatestMinimum(field));
}